

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.h
# Opt level: O3

void __thiscall llvm::buffer_ostream::~buffer_ostream(buffer_ostream *this)

{
  ~buffer_ostream(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~buffer_ostream() override { OS << str(); }